

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filetime.cpp
# Opt level: O0

VOID GetSystemTimeAsFileTime(LPFILETIME lpSystemTimeAsFileTime)

{
  int iVar1;
  FILETIME FVar2;
  undefined1 local_20 [8];
  timeval Time;
  LPFILETIME lpSystemTimeAsFileTime_local;
  
  Time.tv_usec = (__suseconds_t)lpSystemTimeAsFileTime;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  iVar1 = gettimeofday((timeval *)local_20,(__timezone_ptr_t)0x0);
  if (iVar1 == 0) {
    FVar2 = FILEUnixTimeToFileTime((time_t)local_20,Time.tv_sec * 1000);
    *(FILETIME *)Time.tv_usec = FVar2;
  }
  else {
    fprintf(_stderr,"] %s %s:%d","GetSystemTimeAsFileTime",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/filetime.cpp"
            ,0x204);
    fprintf(_stderr,"gettimeofday() failed");
    FVar2 = FILEUnixTimeToFileTime(0,0);
    *(FILETIME *)Time.tv_usec = FVar2;
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return;
}

Assistant:

VOID
PALAPI
GetSystemTimeAsFileTime(
            OUT LPFILETIME lpSystemTimeAsFileTime)
{
    struct timeval Time;

    PERF_ENTRY(GetSystemTimeAsFileTime);
    ENTRY("GetSystemTimeAsFileTime(lpSystemTimeAsFileTime=%p)\n", 
          lpSystemTimeAsFileTime);

    if ( gettimeofday( &Time, NULL ) != 0 )
    {
        ASSERT("gettimeofday() failed");
        /* no way to indicate failure, so set time to zero */
        *lpSystemTimeAsFileTime = FILEUnixTimeToFileTime( 0, 0 );
    }
    else
    {
        /* use (tv_usec * 1000) because 2nd arg is in nanoseconds */
        *lpSystemTimeAsFileTime = FILEUnixTimeToFileTime( Time.tv_sec,
                                                          Time.tv_usec * 1000 );
    }

    LOGEXIT("GetSystemTimeAsFileTime returns.\n");
    PERF_EXIT(GetSystemTimeAsFileTime);
}